

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O3

int tx_input_free(wally_tx_input *input,_Bool free_parent)

{
  int in_EAX;
  int extraout_EAX;
  int extraout_EAX_00;
  size_t len;
  
  if (input != (wally_tx_input *)0x0) {
    len = input->script_len;
    clear_and_free(input->script,len);
    tx_witness_stack_free(input->witness,SUB81(len,0));
    wally_tx_elements_input_issuance_free(input);
    wally_clear(input,0xd0);
    in_EAX = extraout_EAX;
    if (free_parent) {
      wally_free(input);
      return extraout_EAX_00;
    }
  }
  return in_EAX;
}

Assistant:

static int tx_input_free(struct wally_tx_input *input, bool free_parent)
{
    if (input) {
        clear_and_free(input->script, input->script_len);
        tx_witness_stack_free(input->witness, true);
        wally_tx_elements_input_issuance_free(input);
        wally_clear(input, sizeof(*input));
        if (free_parent)
            wally_free(input);
    }
    return WALLY_OK;
}